

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempExpression.cpp
# Opt level: O1

void __thiscall IRT::TempExpression::TempExpression(TempExpression *this,Temporary *temporary)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->super_Expression).super_BaseElement._vptr_BaseElement =
       (_func_int **)&PTR__TempExpression_0016eb30;
  paVar1 = &(this->temporary_).name_.field_2;
  (this->temporary_).name_._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (temporary->name_)._M_dataplus._M_p;
  paVar2 = &(temporary->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(temporary->name_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->temporary_).name_.field_2 + 8) = uVar4;
  }
  else {
    (this->temporary_).name_._M_dataplus._M_p = pcVar3;
    (this->temporary_).name_.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->temporary_).name_._M_string_length = (temporary->name_)._M_string_length;
  (temporary->name_)._M_dataplus._M_p = (pointer)paVar2;
  (temporary->name_)._M_string_length = 0;
  (temporary->name_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

IRT::TempExpression::TempExpression(IRT::Temporary temporary)
    : temporary_(std::move(temporary)) {}